

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

const_buffer * __thiscall
cppcms::impl::cgi::fastcgi::format_output
          (fastcgi *this,const_buffer *input,bool completed,error_code *param_4)

{
  fastcgi *pfVar1;
  byte in_CL;
  mutable_buffer *in_RSI;
  buffer_impl<const_char_*> *in_RDI;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar2;
  size_t next_size;
  int pad_len;
  size_t chunk;
  size_t chunk_consumed;
  size_t in_size;
  size_t reminder;
  entry *chunks;
  const_buffer in;
  const_buffer *packet;
  const_buffer *in_stack_fffffffffffffd38;
  const_buffer *in_stack_fffffffffffffd40;
  fastcgi *this_00;
  string *in_stack_fffffffffffffd48;
  buffer_impl<const_char_*> *this_01;
  const_buffer *in_stack_fffffffffffffd70;
  fastcgi *local_1d0;
  fastcgi *local_100;
  size_t local_f8;
  fastcgi *local_e8;
  entry *local_d0;
  
  this_01 = in_RDI;
  booster::aio::const_buffer::const_buffer((const_buffer *)0x48a6f9);
  if (((ulong)(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 *)&in_RSI[9].super_buffer_impl<char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
               )->_M_impl).super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    booster::aio::buffer(in_stack_fffffffffffffd48);
    booster::aio::operator+((const_buffer *)in_RSI,(const_buffer *)this_01);
    booster::aio::const_buffer::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x48a767);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x48a774);
    *(undefined1 *)
     &(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         *)&in_RSI[9].super_buffer_impl<char_*>.vec_.
            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
       )->_M_impl).super__Vector_impl_data._M_end_of_storage = 1;
  }
  else {
    booster::aio::const_buffer::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  booster::aio::const_buffer::const_buffer((const_buffer *)0x48a7ec);
  pVar2 = booster::aio::buffer_impl<const_char_*>::get(this_01);
  local_d0 = pVar2.first;
  pfVar1 = (fastcgi *)booster::aio::buffer_impl<const_char_*>::bytes_count(in_RDI);
  local_f8 = 0;
  this_00 = pfVar1;
  local_e8 = pfVar1;
  while (local_e8 != (fastcgi *)0x0) {
    if (local_e8 < (fastcgi *)0x10000) {
      local_100 = local_e8;
      ((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size = 0;
      *(undefined1 *)&((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size = 1;
      *(undefined1 *)((long)&((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size + 1) = 6;
      *(undefined2 *)((long)&((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size + 2) =
           *(undefined2 *)
            ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                       *)&in_RSI[7].super_buffer_impl<char_*>.vec_.
                          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                     )->_M_impl).super__Vector_impl_data._M_start + 4);
      *(undefined2 *)((long)&((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size + 4) =
           local_e8._0_2_;
      *(byte *)((long)&((entry *)&in_RSI[6].super_buffer_impl<char_*>.entry_)->size + 6) =
           8U - (char)local_e8 & 7;
      fcgi_header::to_net((fcgi_header *)this_00);
      booster::aio::buffer(in_RSI,(size_t)this_01);
      booster::aio::const_buffer::const_buffer(in_stack_fffffffffffffd70,in_RSI);
      booster::aio::operator+=((const_buffer *)this_00,in_stack_fffffffffffffd38);
      booster::aio::const_buffer::~const_buffer((const_buffer *)0x48aaca);
      booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x48aad7);
    }
    else {
      local_100 = (fastcgi *)0xffff;
      if (((fastcgi *)0xffff < pfVar1) && (local_e8 == pfVar1)) {
        *(undefined1 *)
         &(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             *)&in_RSI[6].super_buffer_impl<char_*>.vec_.
                super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
           )->_M_impl).super__Vector_impl_data._M_start = 1;
        *(undefined1 *)
         ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    *)&in_RSI[6].super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                  )->_M_impl).super__Vector_impl_data._M_start + 1) = 6;
        *(undefined2 *)
         ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    *)&in_RSI[6].super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                  )->_M_impl).super__Vector_impl_data._M_start + 2) =
             *(undefined2 *)
              ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                         *)&in_RSI[7].super_buffer_impl<char_*>.vec_.
                            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                       )->_M_impl).super__Vector_impl_data._M_start + 4);
        *(undefined2 *)
         ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    *)&in_RSI[6].super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                  )->_M_impl).super__Vector_impl_data._M_start + 4) = 0xffff;
        *(undefined1 *)
         ((long)&(((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    *)&in_RSI[6].super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                  )->_M_impl).super__Vector_impl_data._M_start + 6) = 1;
        fcgi_header::to_net((fcgi_header *)this_00);
      }
      booster::aio::buffer(in_RSI,(size_t)this_01);
      booster::aio::const_buffer::const_buffer(in_stack_fffffffffffffd70,in_RSI);
      booster::aio::operator+=((const_buffer *)this_00,in_stack_fffffffffffffd38);
      booster::aio::const_buffer::~const_buffer((const_buffer *)0x48a99d);
      booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x48a9aa);
    }
    local_e8 = (fastcgi *)((long)local_e8 - (long)local_100);
    while (local_100 != (fastcgi *)0x0) {
      local_1d0 = (fastcgi *)(local_d0->size - local_f8);
      if (local_100 < local_1d0) {
        local_1d0 = local_100;
      }
      booster::aio::buffer(in_RSI,(size_t)this_01);
      booster::aio::operator+=((const_buffer *)this_00,in_stack_fffffffffffffd38);
      booster::aio::const_buffer::~const_buffer((const_buffer *)0x48abd8);
      local_f8 = (long)&(local_1d0->super_connection)._vptr_connection + local_f8;
      local_100 = (fastcgi *)((long)local_100 - (long)local_1d0);
      if (local_f8 == local_d0->size) {
        local_d0 = local_d0 + 1;
        local_f8 = 0;
      }
    }
    booster::aio::buffer(in_RSI,(size_t)this_01);
    booster::aio::operator+=((const_buffer *)this_00,in_stack_fffffffffffffd38);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x48acad);
  }
  if ((in_CL & 1) != 0) {
    prepare_eof(this_00);
    booster::aio::buffer(in_RSI,(size_t)this_01);
    booster::aio::const_buffer::const_buffer(in_stack_fffffffffffffd70,in_RSI);
    booster::aio::operator+=((const_buffer *)this_00,in_stack_fffffffffffffd38);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x48ad3b);
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x48ad45);
  }
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x48adb0);
  return (const_buffer *)this_01;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &input,bool completed,booster::system::error_code &)
		{
			booster::aio::const_buffer in;
			if(!response_headers_written_) {
				in=booster::aio::buffer(response_headers_) + input;
				response_headers_written_ = true;
			}
			else {
				in = input;
			}
			booster::aio::const_buffer packet;
			booster::aio::const_buffer::entry const *chunks = in.get().first;
//#define DEBUG_FASTCGI
#ifdef DEBUG_FASTCGI
			{
				size_t n=in.get().second;
				printf("Format output of %d:\n",int(in.bytes_count()));
				for(size_t i=0;i<n;i++) {
					printf("[%.*s]",int(chunks[i].size),chunks[i].ptr);
				}
				if(completed) {
					printf("\nEOF\n");
				}
				else {
					printf("\n---\n");
				}
			}
#endif
			size_t reminder = in.bytes_count();
			size_t in_size = reminder;
			size_t chunk_consumed = 0;
			while(reminder > 0) {
				static const char pad[8]={0,0,0,0,0,0,0,0};
				static const size_t max_packet_len = 65535;
				size_t chunk = 0;
				int pad_len = 0;
				if(reminder > max_packet_len) {
					chunk = max_packet_len;
					if(in_size > max_packet_len && reminder == in_size) {
						// prepare only once
						full_header_.version = fcgi_version_1;
						full_header_.type=fcgi_stdout;
						full_header_.request_id=request_id_;
						full_header_.content_length = max_packet_len;
						full_header_.padding_length = pad_len = 1;
						full_header_.to_net();
					}
					else {
						pad_len = 1;
					}
					packet += io::buffer(&full_header_,sizeof(full_header_));
				}
				else {
					chunk = reminder;
					memset(&header_,0,sizeof(header_));
					header_.version=fcgi_version_1;
					header_.type=fcgi_stdout;
					header_.request_id=request_id_;
					header_.content_length = reminder;
					header_.padding_length =pad_len = (8 - (reminder % 8)) % 8;
					header_.to_net();

					packet += io::buffer(&header_,sizeof(header_));
				}

				reminder -= chunk;
				while(chunk > 0) {
					size_t next_size = chunks->size - chunk_consumed;
					if(next_size > chunk)
						next_size = chunk;

					packet += io::buffer(chunks->ptr + chunk_consumed, next_size);
					chunk_consumed += next_size;
					chunk -= next_size;
					if(chunk_consumed == chunks->size) {
						chunks++;
						chunk_consumed = 0;
					}
				}

				packet += io::buffer(pad,pad_len);
			}
			if(completed) {
				prepare_eof();
				packet += io::buffer(&eof_,sizeof(eof_));
			}
			#ifdef DEBUG_FASTCGI
			std::pair<booster::aio::const_buffer::entry const *,size_t> cnk = packet.get();
			for(size_t i=0;i<cnk.second;i++) {
				std::cerr << "[ " << (void const *)(cnk.first[i].ptr) << " " << cnk.first[i].size << "]\n" << std::endl;
			}
			#endif
			return packet;
		}